

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O1

void __thiscall ProfileHandler::GetState(ProfileHandler *this,ProfileHandlerState *state)

{
  bool bVar1;
  undefined1 local_b0 [8];
  ScopedSignalBlocker block;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  sl.lock_ = &this->control_lock_;
  LOCK();
  bVar1 = (this->control_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->control_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    SpinLock::SlowLock(sl.lock_);
  }
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_b0,this->signal_number_);
  block.sig_set_.__val[0xf] = (unsigned_long)&this->signal_lock_;
  LOCK();
  bVar1 = (this->signal_lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar1) {
    (this->signal_lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar1) {
    SpinLock::SlowLock((SpinLock *)block.sig_set_.__val[0xf]);
  }
  state->interrupts = this->interrupts_;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)(block.sig_set_.__val + 0xf));
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_b0);
  state->frequency = this->frequency_;
  state->callback_count = this->callback_count_;
  state->allowed = this->allowed_;
  SpinLockHolder::~SpinLockHolder(&sl);
  return;
}

Assistant:

void ProfileHandler::GetState(ProfileHandlerState* state) {
  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);  // Protects interrupts_.
    state->interrupts = interrupts_;
  }
  state->frequency = frequency_;
  state->callback_count = callback_count_;
  state->allowed = allowed_;
}